

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::GetAsyncCommandResponse_SetupDataSource::
~GetAsyncCommandResponse_SetupDataSource(GetAsyncCommandResponse_SetupDataSource *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GetAsyncCommandResponse_SetupDataSource_00409470;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  unique_ptr<perfetto::protos::gen::DataSourceConfig,_std::default_delete<perfetto::protos::gen::DataSourceConfig>_>
  ::~unique_ptr(&(this->config_).ptr_);
  return;
}

Assistant:

GetAsyncCommandResponse_SetupDataSource::~GetAsyncCommandResponse_SetupDataSource() = default;